

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::RemoveADirectory(string *source)

{
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *pcVar4;
  ulong dindex;
  Directory dir;
  string fullPath;
  Directory DStack_58;
  uint local_4c;
  string local_48;
  
  bVar1 = GetPermissions(source,&local_4c);
  if (bVar1) {
    SetPermissions(source,local_4c | 0x80,false);
  }
  Directory::Directory(&DStack_58);
  Directory::Load(&DStack_58,source);
  dindex = 0;
  do {
    uVar3 = Directory::GetNumberOfFiles(&DStack_58);
    if (uVar3 <= dindex) {
      iVar2 = Rmdir(source);
      bVar1 = iVar2 == 0;
LAB_00474429:
      Directory::~Directory(&DStack_58);
      return bVar1;
    }
    pcVar4 = Directory::GetFile(&DStack_58,dindex);
    if ((*pcVar4 != '.') || (pcVar4[1] != '\0')) {
      pcVar4 = Directory::GetFile(&DStack_58,dindex);
      if ((*pcVar4 != '.') || ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))) {
        std::__cxx11::string::string((string *)&local_48,(string *)source);
        std::__cxx11::string::append((char *)&local_48);
        Directory::GetFile(&DStack_58,dindex);
        std::__cxx11::string::append((char *)&local_48);
        bVar1 = FileIsDirectory(&local_48);
        if (bVar1) {
          bVar1 = FileIsSymlink(&local_48);
          if (bVar1) goto LAB_004743e8;
          bVar1 = RemoveADirectory(&local_48);
        }
        else {
LAB_004743e8:
          bVar1 = RemoveFile(&local_48);
        }
        if (bVar1 == false) {
          std::__cxx11::string::~string((string *)&local_48);
          bVar1 = false;
          goto LAB_00474429;
        }
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
    dindex = dindex + 1;
  } while( true );
}

Assistant:

bool SystemTools::RemoveADirectory(const std::string& source)
{
  // Add write permission to the directory so we can modify its
  // content to remove files and directories from it.
  mode_t mode;
  if(SystemTools::GetPermissions(source, mode))
    {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IWRITE;
#else
    mode |= S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
    }

  Directory dir;
#ifdef _WIN32
  dir.Load(Encoding::ToNarrow(
             SystemTools::ConvertToWindowsExtendedPath(source)));
#else
  dir.Load(source);
#endif
  size_t fileNum;
  for (fileNum = 0; fileNum <  dir.GetNumberOfFiles(); ++fileNum)
    {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".."))
      {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if(SystemTools::FileIsDirectory(fullPath) &&
        !SystemTools::FileIsSymlink(fullPath))
        {
        if (!SystemTools::RemoveADirectory(fullPath))
          {
          return false;
          }
        }
      else
        {
        if(!SystemTools::RemoveFile(fullPath))
          {
          return false;
          }
        }
      }
    }

  return (Rmdir(source) == 0);
}